

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainCMakefileLanguageRules
          (cmGlobalUnixMakefileGenerator3 *this,cmGeneratedFileStream *cmakefileStream,
          vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
          *lGenerators)

{
  cmLocalUnixMakefileGenerator3 *this_00;
  pointer puVar1;
  bool bVar2;
  TargetType TVar3;
  ostream *poVar4;
  pointer puVar5;
  pointer puVar6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string tname;
  string local_98;
  string local_78;
  pointer local_58;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  undefined8 local_40;
  char *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)cmakefileStream,"# Dependency information for all targets:\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)cmakefileStream,"set(CMAKE_DEPEND_INFO_FILES\n",0x1c);
  puVar5 = (lGenerators->
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_58 = (lGenerators->
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != local_58) {
    do {
      this_00 = (cmLocalUnixMakefileGenerator3 *)
                (puVar5->_M_t).
                super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t
                .super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
                super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
      puVar1 = *(pointer *)
                &((GeneratorTargetVector *)((long)&this_00->super_cmLocalCommonGenerator + 0x150))->
                 super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
      ;
      for (puVar6 = *(pointer *)
                     &((GeneratorTargetVector *)
                      ((long)&this_00->super_cmLocalCommonGenerator + 0x148))->
                      super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
          ; puVar6 != puVar1; puVar6 = puVar6 + 1) {
        bVar2 = cmGeneratorTarget::IsInBuildSystem
                          ((puVar6->_M_t).
                           super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                           .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
        if (bVar2) {
          TVar3 = cmGeneratorTarget::GetType
                            ((puVar6->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                             .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
          if (TVar3 != GLOBAL_TARGET) {
            cmLocalUnixMakefileGenerator3::GetRelativeTargetDirectory_abi_cxx11_
                      (&local_98,this_00,
                       (puVar6->_M_t).
                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                       .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl);
            local_50._M_len = local_98._M_string_length;
            local_50._M_str = local_98._M_dataplus._M_p;
            local_40 = 0x11;
            local_38 = "/DependInfo.cmake";
            views._M_len = 2;
            views._M_array = &local_50;
            cmCatViews_abi_cxx11_(&local_78,views);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            cmsys::SystemTools::ConvertToUnixSlashes(&local_78);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)cmakefileStream,"  \"",3);
            poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)cmakefileStream,local_78._M_dataplus._M_p,
                                local_78._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\n",2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
          }
        }
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != local_58);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)cmakefileStream,"  )\n",4);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteMainCMakefileLanguageRules(
  cmGeneratedFileStream& cmakefileStream,
  std::vector<std::unique_ptr<cmLocalGenerator>>& lGenerators)
{
  // now list all the target info files
  cmakefileStream << "# Dependency information for all targets:\n";
  cmakefileStream << "set(CMAKE_DEPEND_INFO_FILES\n";
  for (const auto& lGenerator : lGenerators) {
    const auto& lg =
      cm::static_reference_cast<cmLocalUnixMakefileGenerator3>(lGenerator);
    // for all of out targets
    for (const auto& tgt : lg.GetGeneratorTargets()) {
      if (tgt->IsInBuildSystem() &&
          tgt->GetType() != cmStateEnums::GLOBAL_TARGET) {
        std::string tname = cmStrCat(lg.GetRelativeTargetDirectory(tgt.get()),
                                     "/DependInfo.cmake");
        cmSystemTools::ConvertToUnixSlashes(tname);
        cmakefileStream << "  \"" << tname << "\"\n";
      }
    }
  }
  cmakefileStream << "  )\n";
}